

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  undefined8 *in_RSI;
  int in_EDI;
  exception *e;
  ifstream is;
  grid b;
  grid *in_stack_00000320;
  ifstream *in_stack_00000328;
  char *in_stack_fffffffffffffd18;
  grid *in_stack_fffffffffffffd20;
  uint idx;
  grid *b_00;
  char *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  long local_288 [65];
  undefined1 local_79 [33];
  undefined4 local_58;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  grid::grid(in_stack_fffffffffffffd20);
  if (local_8 == 2) {
    generate_sum_table();
    idx = (uint)((ulong)local_10[1] >> 0x20);
    b_00 = (grid *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(allocator<char> *)b_00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    if (bVar1) {
      print_sum_table();
      local_4 = 0;
      local_58 = 1;
    }
    else {
      std::ifstream::ifstream(local_288,local_10[1],8);
      bVar2 = std::ios::operator!((ios *)((long)local_288 + *(long *)(local_288[0] + -0x18)));
      if ((bVar2 & 1) == 0) {
        bVar1 = read_data(in_stack_00000328,in_stack_00000320);
        if (bVar1) {
          solve(b_00,idx);
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"can\'t open input file");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
      }
      local_58 = 1;
      std::ifstream::~ifstream(local_288);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"USAGE: ");
    poVar3 = std::operator<<(poVar3,(char *)*local_10);
    poVar3 = std::operator<<(poVar3," INPUT-FILE");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_58 = 1;
  }
  grid::~grid(in_stack_fffffffffffffd20);
  return local_4;
}

Assistant:

int main(int argc, char **argv) try {
	grid b;
	
	if(argc != 2) {
		cerr << "USAGE: " << argv[0] << " INPUT-FILE" << endl;
		return 1;
	}

	generate_sum_table();
	if(string(argv[1]) == "-test") {
		print_sum_table();
		return 0;
	}

	ifstream is(argv[1]);
	if(!is) {
		cerr << "can't open input file" << endl;
		return 1;
	}

	if(!read_data(is, b))
		return 1;
	solve(b, 0);
	return 0;
} catch(exception &e) {
	cerr << "INTERNAL ERROR: " << e.what() << endl;
	return 1;
}